

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O1

bool __thiscall
xray_re::xr_ini_file::r_line(xr_ini_file *this,char *sname,size_t lindex,char **lname,char **lvalue)

{
  pointer ppiVar1;
  ini_item *piVar2;
  ini_section *piVar3;
  ulong uVar4;
  
  piVar3 = r_section(this,sname);
  ppiVar1 = (piVar3->items).
            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(piVar3->items).
                super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppiVar1 >> 3;
  if (lindex < uVar4) {
    piVar2 = ppiVar1[lindex];
    if (lname != (char **)0x0) {
      *lname = (piVar2->name)._M_dataplus._M_p;
    }
    if (lvalue != (char **)0x0) {
      *lvalue = (piVar2->value)._M_dataplus._M_p;
    }
  }
  return lindex < uVar4;
}

Assistant:

bool xr_ini_file::r_line(const char* sname, size_t lindex, const char** lname, const char** lvalue) const
{
	const ini_section* section = r_section(sname);
	if (lindex >= section->size())
		return false;
	const ini_item* item = section->items[lindex];
	if (lname)
		*lname = item->name.c_str();
	if (lvalue)
		*lvalue = item->value.c_str();
	return true;
}